

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  long lVar1;
  ZSTD_compressionParameters cParams;
  
  ZSTD_getCParams(&cParams,compressionLevel,0,dictSize);
  lVar1 = 1L << ((byte)cParams.chainLog & 0x3f);
  if (cParams.strategy == ZSTD_fast) {
    lVar1 = 0;
  }
  return dictSize + ((1L << ((byte)cParams.hashLog & 0x3f)) + lVar1) * 4 + 0x2b04;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, 0, dictSize);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}